

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

int gzrewind(gzFile file)

{
  __off_t _Var1;
  int iVar2;
  
  iVar2 = -1;
  if (((file != (gzFile)0x0) && (*file == 0x1c4f)) && (*(int *)((long)file + 0x6c) == 0)) {
    _Var1 = lseek(*(int *)((long)file + 4),*(__off_t *)((long)file + 0x40),0);
    if (_Var1 != -1) {
      gz_reset((gz_statep)file);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int ZEXPORT gzrewind(gzFile file)
{
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no error */
    if (state->mode != GZ_READ || state->err != Z_OK)
        return -1;

    /* back up and start over */
    if (LSEEK(state->fd, state->start, SEEK_SET) == -1)
        return -1;
    gz_reset(state);
    return 0;
}